

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

void __thiscall Polymer::Move(Polymer *this,int pol_index)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  string *psVar5;
  SpeciesTracker *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *this_01;
  unsigned_long start;
  FixedElement *pFVar6;
  element_type *peVar7;
  undefined1 local_c8 [8];
  Ptr transcript;
  Interval<std::shared_ptr<BindingSite>,_unsigned_long> *interval;
  iterator __end2;
  iterator __begin2;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  *__range2;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  results;
  undefined1 local_78 [7];
  bool terminating;
  undefined1 local_61;
  undefined1 local_60 [7];
  bool mask_collision;
  undefined1 local_49;
  undefined4 local_48;
  bool readthrough_collision;
  int local_40;
  bool pol_collision;
  int old_stop;
  int local_2c;
  undefined1 local_28 [4];
  int old_start;
  Ptr pol;
  int pol_index_local;
  Polymer *this_local;
  
  pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       pol_index;
  MobileElementManager::GetPol((MobileElementManager *)local_28,(int)this + 0x90);
  peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  local_2c = MobileElement::start(peVar4);
  peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  local_40 = MobileElement::stop(peVar4);
  peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  (*peVar4->_vptr_MobileElement[2])();
  readthrough_collision =
       CheckPolCollisions(this,pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._4_4_);
  if (readthrough_collision) {
    peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
    (*peVar4->_vptr_MobileElement[3])();
    local_48 = 1;
  }
  else {
    peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
    bVar1 = MobileElement::polymerasereadthrough(peVar4);
    if (bVar1) {
      std::shared_ptr<MobileElement>::shared_ptr
                ((shared_ptr<MobileElement> *)local_60,(shared_ptr<MobileElement> *)local_28);
      bVar1 = CheckReadthroughPolCollisions(this,(shared_ptr<MobileElement> *)local_60);
      std::shared_ptr<MobileElement>::~shared_ptr((shared_ptr<MobileElement> *)local_60);
      local_49 = bVar1;
      if (bVar1) {
        peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
        (*peVar4->_vptr_MobileElement[3])();
        local_48 = 1;
        goto LAB_0011efa6;
      }
    }
    std::shared_ptr<MobileElement>::shared_ptr
              ((shared_ptr<MobileElement> *)local_78,(shared_ptr<MobileElement> *)local_28);
    bVar1 = CheckMaskCollisions(this,(shared_ptr<MobileElement> *)local_78);
    std::shared_ptr<MobileElement>::~shared_ptr((shared_ptr<MobileElement> *)local_78);
    local_61 = bVar1;
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
      (*peVar4->_vptr_MobileElement[3])();
      local_48 = 1;
    }
    else {
      peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
      psVar5 = MobileElement::name_abi_cxx11_(peVar4);
      bVar1 = std::operator==(psVar5,"__ribosome");
      if (bVar1) {
        this_00 = SpeciesTracker::Instance();
        this_01 = SpeciesTracker::codon_map_abi_cxx11_(this_00);
        bVar1 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::empty(this_01);
        if (!bVar1) {
          MobileElementManager::DecrementtRNA(&this->polymerases_,local_40);
        }
      }
      iVar3 = local_2c;
      peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
      iVar2 = MobileElement::start(peVar4);
      CheckBehind(this,iVar3,iVar2);
      peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
      psVar5 = MobileElement::name_abi_cxx11_(peVar4);
      bVar1 = std::operator==(psVar5,"__rnase");
      iVar3 = local_40;
      if (bVar1) {
        peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
        iVar2 = MobileElement::stop(peVar4);
        CheckAheadRnase(this,iVar3,iVar2);
      }
      else {
        peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
        iVar2 = MobileElement::stop(peVar4);
        CheckAhead(this,iVar3,iVar2);
      }
      results.
      super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
           CheckTermination(this,pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi._4_4_);
      if ((bool)results.
                super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_) {
        peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
        psVar5 = MobileElement::name_abi_cxx11_(peVar4);
        bVar1 = std::operator!=(psVar5,"__rnase");
        if (bVar1) {
          std::
          vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ::vector((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                    *)&__range2);
          start = (unsigned_long)local_2c;
          peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_28);
          iVar3 = MobileElement::stop(peVar4);
          IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
                    (&this->binding_sites_,start,(long)iVar3,(intervalVector *)&__range2);
          __end2 = std::
                   vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                   ::begin((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                            *)&__range2);
          interval = (Interval<std::shared_ptr<BindingSite>,_unsigned_long> *)
                     std::
                     vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                     ::end((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                            *)&__range2);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
                                             *)&interval), bVar1) {
            transcript.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 __gnu_cxx::
                 __normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
                 ::operator*(&__end2);
            pFVar6 = &std::
                      __shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&((reference)
                                     transcript.
                                     super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi)->value)->super_FixedElement;
            FixedElement::Uncover(pFVar6);
            pFVar6 = &std::
                      __shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)(transcript.
                                     super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi + 1))->super_FixedElement;
            bVar1 = FixedElement::WasUncovered(pFVar6);
            if (bVar1) {
              pFVar6 = &std::
                        __shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                        operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)(transcript.
                                       super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount._M_pi + 1))->super_FixedElement;
              psVar5 = FixedElement::name_abi_cxx11_(pFVar6);
              LogUncover(this,psVar5);
            }
            pFVar6 = &std::
                      __shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)(transcript.
                                     super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi + 1))->super_FixedElement;
            FixedElement::ResetState(pFVar6);
            __gnu_cxx::
            __normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
            ::operator++(&__end2);
          }
          local_48 = 1;
          std::
          vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ::~vector((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                     *)&__range2);
          goto LAB_0011efa6;
        }
      }
      MobileElementManager::GetAttached((MobileElementManager *)local_c8,(int)this + 0x90);
      bVar1 = std::operator!=((shared_ptr<Polymer> *)local_c8,(nullptr_t)0x0);
      if (bVar1) {
        peVar7 = std::__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_c8);
        (*peVar7->_vptr_Polymer[2])();
      }
      peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
      psVar5 = MobileElement::name_abi_cxx11_(peVar4);
      bVar1 = std::operator==(psVar5,"__ribosome");
      if (bVar1) {
        MobileElementManager::UpdatePropensity
                  (&this->polymerases_,
                   pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi._4_4_);
      }
      std::shared_ptr<Polymer>::~shared_ptr((shared_ptr<Polymer> *)local_c8);
      local_48 = 0;
    }
  }
LAB_0011efa6:
  std::shared_ptr<MobileElement>::~shared_ptr((shared_ptr<MobileElement> *)local_28);
  return;
}

Assistant:

void Polymer::Move(int pol_index) {
  auto pol = polymerases_.GetPol(pol_index); 

  // Record old positions
  int old_start = pol->start();
  int old_stop = pol->stop();

  // Move polymerase
  pol->Move();

  // Check for upstream polymerase collision
  bool pol_collision = CheckPolCollisions(pol_index);
  if (pol_collision) {
    //pol->MoveBack();
    pol->MoveBack();
    return;
  }

  // Check for collisions with polymerases at the start of the genome,
  // if simulating readthrough on a circular plasmid
  if (pol->polymerasereadthrough()) {
    bool readthrough_collision = CheckReadthroughPolCollisions(pol);
    if (readthrough_collision) {
      pol->MoveBack();
      return;
    }
  }

  // Check for collisions with mask
  bool mask_collision = CheckMaskCollisions(pol);
  if (mask_collision) {
    //pol->MoveBack();
    pol->MoveBack();
    return;
  }

  // Choose a tRNA to consume, if pol is a ribosome AND 
  // the simulation is using tRNAs
  if (pol->name() == "__ribosome" && !SpeciesTracker::Instance().codon_map().empty()) {
    polymerases_.DecrementtRNA(old_stop);
  }

  // Check for new covered and uncovered elements
  CheckBehind(old_start, pol->start());
  if (pol->name() == "__rnase") {
    CheckAheadRnase(old_stop, pol->stop());
  } else {
    CheckAhead(old_stop, pol->stop());
  }
  
  // Check if polymerase has run into a terminator
  bool terminating = CheckTermination(pol_index);
  if (terminating && pol->name() != "__rnase") {
    std::vector<Interval<BindingSite::Ptr>> results;
    binding_sites_.findOverlapping(old_start, pol->stop(), results);
    for (auto &interval : results) {
      interval.value->Uncover();
      if (interval.value->WasUncovered()) {
        // Record changes that species was covered
        LogUncover(interval.value->name());
      }
      interval.value->ResetState();
    }
    return;
  }

  auto transcript = polymerases_.GetAttached(pol_index);
  if (transcript != nullptr) {
    transcript->ShiftMask();
  }

  // Update propensity for new codon (TODO: make its own function)
  if (pol->name() == "__ribosome") {
    polymerases_.UpdatePropensity(pol_index);
  }
}